

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

object * __thiscall pybind11::object::operator=(object *this,object *other)

{
  PyObject *pPVar1;
  
  if (this != other) {
    pPVar1 = (this->super_handle).m_ptr;
    (this->super_handle).m_ptr = (other->super_handle).m_ptr;
    (other->super_handle).m_ptr = (PyObject *)0x0;
    if ((pPVar1 != (PyObject *)0x0) &&
       (pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1, pPVar1->ob_refcnt == 0)) {
      _Py_Dealloc();
    }
  }
  return this;
}

Assistant:

object &operator=(object &&other) noexcept {
        if (this != &other) {
            handle temp(m_ptr);
            m_ptr = other.m_ptr;
            other.m_ptr = nullptr;
            temp.dec_ref();
        }
        return *this;
    }